

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.c
# Opt level: O0

void literal_clear(EditLine *el)

{
  el_literal_t *peVar1;
  ulong local_20;
  size_t i;
  el_literal_t *l;
  EditLine *el_local;
  
  peVar1 = &el->el_literal;
  if ((el->el_literal).l_len != 0) {
    for (local_20 = 0; local_20 < (el->el_literal).l_idx; local_20 = local_20 + 1) {
      free(peVar1->l_buf[local_20]);
    }
    free(peVar1->l_buf);
    peVar1->l_buf = (char **)0x0;
    (el->el_literal).l_len = 0;
    (el->el_literal).l_idx = 0;
  }
  return;
}

Assistant:

libedit_private void
literal_clear(EditLine *el)
{
	el_literal_t *l = &el->el_literal;
	size_t i;

	if (l->l_len == 0)
		return;

	for (i = 0; i < l->l_idx; i++)
		el_free(l->l_buf[i]);
	el_free(l->l_buf);
	l->l_buf = NULL;
	l->l_len = 0;
	l->l_idx = 0;
}